

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O1

vss * Search::generalSearch
                (vss *__return_storage_ptr__,Problem *problem,int iterationLimit,int fringeSize,
                bool isRandomInitialize,int expanderCode,int completenessCode)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  vector<State,_std::allocator<State>_> *oldfringe;
  int iVar4;
  vector<State,_std::allocator<State>_> *this;
  vector<State,_std::allocator<State>_> newfringe;
  vector<State,_std::allocator<State>_> fringe;
  State randomState;
  vector<State,_std::allocator<State>_> local_168;
  vector<State,_std::allocator<State>_> local_148;
  State local_128;
  vss *local_f8;
  string local_f0;
  vector<State,_std::allocator<State>_> local_d0;
  vector<State,_std::allocator<State>_> local_b8;
  vector<State,_std::allocator<State>_> local_a0;
  State local_88;
  vector<State,_std::allocator<State>_> local_60;
  vector<State,_std::allocator<State>_> local_48;
  
  local_f8 = __return_storage_ptr__;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Entered general search",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  local_148.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Problem::clearValidStore(problem);
  if (isRandomInitialize) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Random initialization",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    if (0 < fringeSize) {
      iVar4 = fringeSize;
      do {
        Problem::generateRandomState(&local_128,problem);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State: ",7);
        std::vector<int,_std::allocator<int>_>::vector(&local_88.bidNumbers,&local_128.bidNumbers);
        local_88.numConflicts = local_128.numConflicts;
        local_88.cost = local_128.cost;
        Problem::getStringFromState_abi_cxx11_(&local_f0,problem,&local_88);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_f0._M_dataplus._M_p,
                            local_f0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (local_88.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::vector<State,_std::allocator<State>_>::push_back(&local_148,&local_128);
        if ((pointer)local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  else {
    Problem::getInitialState(&local_128,problem);
    std::vector<State,_std::allocator<State>_>::emplace_back<State>(&local_148,&local_128);
    if ((pointer)local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (1 < fringeSize) {
      iVar4 = fringeSize + -1;
      do {
        Problem::generateRandomState(&local_128,problem);
        std::vector<State,_std::allocator<State>_>::push_back(&local_148,&local_128);
        if ((pointer)local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initialized fringe",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar4 = 0;
  do {
    std::vector<State,_std::allocator<State>_>::vector(&local_d0,&local_148);
    Problem::fringeExpander
              ((vector<State,_std::allocator<State>_> *)&local_f0,problem,&local_d0,fringeSize,0);
    local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_128.bidNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_f0._M_dataplus._M_p;
    local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_f0._M_string_length;
    local_168.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_f0.field_2._M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)0x0;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_allocated_capacity = 0;
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_128);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&local_f0);
    std::vector<State,_std::allocator<State>_>::~vector(&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Computed new fringe",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    if (iterationLimit <= iVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Exceeded max iterations",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
LAB_00106ba9:
      Problem::getValidStore(local_f8,problem);
      std::vector<State,_std::allocator<State>_>::~vector(&local_168);
      std::vector<State,_std::allocator<State>_>::~vector(&local_148);
      return local_f8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if (completenessCode == 0) {
      std::vector<State,_std::allocator<State>_>::vector(&local_a0,&local_148);
      this = &local_48;
      std::vector<State,_std::allocator<State>_>::vector(this,&local_168);
      oldfringe = &local_a0;
      bVar1 = isCompleteLocalMaximum(oldfringe,this);
    }
    else {
      std::vector<State,_std::allocator<State>_>::vector(&local_b8,&local_148);
      this = &local_60;
      std::vector<State,_std::allocator<State>_>::vector(this,&local_168);
      oldfringe = &local_b8;
      bVar1 = isCompleteLocalMaximum(oldfringe,this);
    }
    std::vector<State,_std::allocator<State>_>::~vector(this);
    std::vector<State,_std::allocator<State>_>::~vector(oldfringe);
    if (bVar1 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reached Local maxima",0x14);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      goto LAB_00106ba9;
    }
    std::vector<State,_std::allocator<State>_>::operator=(&local_148,&local_168);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

vss Search::generalSearch(Problem *problem, int iterationLimit, int fringeSize, bool isRandomInitialize,
                          int expanderCode, int completenessCode) {
    cout<<"Entered general search"<<endl;
    vector<State> fringe;
    vector<State> newfringe;
    problem->clearValidStore();

    // Initialize fringe
    if (isRandomInitialize) {
        cout<<"Random initialization"<<endl;
        for (int i = 0; i < fringeSize; ++i) {
            State randomState = problem->generateRandomState();
            cout<<"State: "<<problem->getStringFromState(randomState)<<endl;
            fringe.push_back(randomState);
        }
    }
    else {
        fringe.push_back(problem->getInitialState());
        for (int i = 0; i < fringeSize - 1; ++i) {
            State randomState = problem->generateRandomState();
            fringe.push_back(randomState);
        }
    }
    cout<<"Initialized fringe"<<endl;

    int iterationCount = 0;
    bool run = true;

    while (run) {
        newfringe = problem->fringeExpander(fringe, fringeSize, 0);
        cout<<"Computed new fringe"<<endl;

        // Check if search is complete
        if (iterationCount >= iterationLimit) {
            run = false;
            cout << "Exceeded max iterations" << endl;
            break;
        }

        cout<<"Iteration: "<<iterationCount<<endl;
        // cout<<"Best state: "<<problem->getStringFromState(newfringe[0])<<endl;

        bool isComplete;

        /*
         * Codes for completeness checking functions
         * 0 : terminate if local maximum found
         */
        switch (completenessCode) {
            case 0:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
                break;
            default:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
        }
        if (isComplete) {
            run = false;
            cout << "Reached Local maxima" << endl;
            break;
        }

        fringe = newfringe;
        iterationCount++;
    }

    return problem->getValidStore();

}